

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsArgumentVariable(FunctionData *function,VariableData *data)

{
  VariableHandle *pVVar1;
  
  pVVar1 = (function->argumentVariables).head;
  while( true ) {
    if (pVVar1 == (VariableHandle *)0x0) {
      return function->contextArgument == data;
    }
    if (pVVar1->variable == data) break;
    pVVar1 = pVVar1->next;
  }
  return true;
}

Assistant:

bool IsArgumentVariable(FunctionData *function, VariableData *data)
{
	for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
	{
		if(data == curr->variable)
			return true;
	}

	if(data == function->contextArgument)
		return true;

	return false;
}